

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Image * __thiscall
pbrt::Image::SelectChannels
          (Image *__return_storage_ptr__,Image *this,ImageChannelDesc *desc,Allocator alloc)

{
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar1;
  long lVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  WrapMode2D local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  descChannelNames;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_68;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_60;
  
  descChannelNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  descChannelNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descChannelNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar4 = 0; uVar4 < (desc->offset).nStored; uVar4 = uVar4 + 1) {
    paVar1 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
              *)(desc->offset).ptr;
    if (paVar1 == (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                   *)0x0) {
      paVar1 = &(desc->offset).field_2;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&descChannelNames,(this->channelNames).ptr + paVar1->fixed[uVar4]);
  }
  local_68.bits =
       (this->encoding).
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       .bits;
  channels.n = (long)descChannelNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)descChannelNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
  channels.ptr = descChannelNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  Image(__return_storage_ptr__,this->format,
        (Point2i)(this->resolution).super_Tuple2<pbrt::Point2,_int>,channels,
        (ColorEncodingHandle *)&local_68,alloc);
  lVar5 = 0;
  for (lVar2 = 0; lVar2 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.y; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 < (this->resolution).super_Tuple2<pbrt::Point2,_int>.x; lVar3 = lVar3 + 1)
    {
      WrapMode2D::WrapMode2D(&local_90,Clamp);
      GetChannels((ImageChannelValues *)&local_60,this,(Point2i)(lVar5 + lVar3),desc,local_90);
      SetChannels(__return_storage_ptr__,(Point2i)(lVar5 + lVar3),(ImageChannelValues *)&local_60);
      InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector(&local_60);
    }
    lVar5 = lVar5 + 0x100000000;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&descChannelNames);
  return __return_storage_ptr__;
}

Assistant:

Image Image::SelectChannels(const ImageChannelDesc &desc, Allocator alloc) const {
    std::vector<std::string> descChannelNames;
    // TODO: descChannelNames = ChannelNames(desc)
    for (size_t i = 0; i < desc.offset.size(); ++i)
        descChannelNames.push_back(channelNames[desc.offset[i]]);

    Image image(format, resolution, descChannelNames, encoding, alloc);
    for (int y = 0; y < resolution.y; ++y)
        for (int x = 0; x < resolution.x; ++x)
            image.SetChannels({x, y}, GetChannels({x, y}, desc));
    return image;
}